

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O0

ScalarReferenceFiniteElement<double> * __thiscall
lf::fe::HierarchicScalarFESpace<double>::ShapeFunctionLayout
          (HierarchicScalarFESpace<double> *this,Entity *entity)

{
  variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>
  *__variants;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_scalar_fe_space_h:140:9),_const_std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_&>
  pSVar1;
  anon_class_1_0_00000001 local_19;
  Entity *local_18;
  Entity *entity_local;
  HierarchicScalarFESpace<double> *this_local;
  
  local_18 = entity;
  entity_local = (Entity *)this;
  __variants = lf::mesh::utils::
               AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
               ::operator()(&this->ref_el_,entity);
  pSVar1 = std::
           visit<lf::fe::HierarchicScalarFESpace<double>::ShapeFunctionLayout(lf::mesh::Entity_const&)const::_lambda(auto:1_const&)_1_,std::variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>const&>
                     (&local_19,__variants);
  return pSVar1;
}

Assistant:

[[nodiscard]] ScalarReferenceFiniteElement<SCALAR> const *ShapeFunctionLayout(
      const lf::mesh::Entity &entity) const override {
    return std::visit(
        [](const auto &fe) -> ScalarReferenceFiniteElement<SCALAR> const * {
          if constexpr (std::is_same_v<decltype(fe),
                                       const std::monostate &>) {  // NOLINT
            LF_VERIFY_MSG(false,
                          "Something is wrong, no "
                          "ScalarReferenceFiniteElement found for "
                          "this entity.");
            return nullptr;  // make compiler happy.
          } else {           // NOLINT
            return &fe;
          }
        },
        ref_el_(entity));
  }